

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureGlyphCache::resizeTextureData(QOpenGLTextureGlyphCache *this,int width,int height)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  QOpenGLContextPrivate *pQVar5;
  QOpenGLContext *pQVar6;
  socklen_t sVar7;
  undefined7 uVar8;
  int in_EDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_01;
  int in_ESI;
  QImageTextureGlyphCache *in_RDI;
  long in_FS_OFFSET;
  bool isCoreProfile;
  QOpenGLShaderProgram *blitProgram;
  QOpenGLFunctions *funcs;
  QOpenGLContext *ctx;
  QString source_1;
  QString source;
  GLuint tmp_texture;
  GLuint oldTexture;
  int oldHeight;
  int oldWidth;
  GLint oldFbo;
  GLuint in_stack_fffffffffffffea8;
  GLuint GVar9;
  ShaderTypeBit in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  GLuint texture;
  GLuint in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  GLenum attachment;
  GLuint in_stack_fffffffffffffebc;
  QImage *in_stack_fffffffffffffec0;
  QOpenGLEngineShaderManager *this_00;
  QOpenGLContext *in_stack_fffffffffffffec8;
  GLint in_stack_fffffffffffffed0;
  GLenum in_stack_fffffffffffffed4;
  QOpenGLFunctions *in_stack_fffffffffffffed8;
  GLint in_stack_fffffffffffffee0;
  GLsizei in_stack_fffffffffffffee8;
  GLsizei in_stack_fffffffffffffef0;
  GLenum in_stack_fffffffffffffef8;
  QFlagsStorage<QOpenGLShader::ShaderTypeBit> in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  GLuint in_stack_ffffffffffffff10;
  int ty;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  QSurfaceFormat local_50 [12];
  undefined4 local_44;
  undefined4 local_40;
  int local_3c;
  socklen_t local_38 [2];
  char local_30 [32];
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_EDX;
  local_c = in_ESI;
  lVar4 = QOpenGLContext::currentContext();
  if (lVar4 == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffec0,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb4,
               (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QMessageLogger::warning
              (local_30,"QOpenGLTextureGlyphCache::resizeTextureData: Called with no context");
  }
  else {
    iVar3 = QOpenGLContext::functions();
    ty = (int)lVar4;
    local_38[1] = 0xaaaaaaaa;
    QOpenGLFunctions::glGetIntegerv
              ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac,(GLint *)0x1a3e23);
    local_38[0] = *(socklen_t *)(*(long *)(in_RDI + 0xb8) + 0x18);
    local_3c = *(int *)(*(long *)(in_RDI + 0xb8) + 0x1c);
    if (local_c < 0x10) {
      local_c = 0x10;
    }
    if (local_10 < 0x10) {
      local_10 = 0x10;
    }
    local_40 = *(undefined4 *)(*(long *)(in_RDI + 0xb8) + 0x10);
    (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,local_c,local_10);
    pQVar5 = QOpenGLContext::d_func((QOpenGLContext *)0x1a3ea8);
    if (((byte)pQVar5[0xfc] & 1) == 0) {
      QOpenGLFunctions::glBindFramebuffer
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      local_44 = 0xaaaaaaaa;
      QOpenGLFunctions::glGenTextures
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffeac,(GLuint *)0x1a3f9b);
      QOpenGLFunctions::glBindTexture
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      GVar9 = 0;
      texture = 0x1908;
      attachment = 0x1401;
      this_00 = (QOpenGLEngineShaderManager *)0x0;
      QOpenGLFunctions::glTexImage2D
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                 (GLint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (GLsizei)in_stack_fffffffffffffec8,0,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffef8,(GLenum)in_RDI,
                 (GLvoid *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      QOpenGLFunctions::glTexParameteri
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0);
      QOpenGLFunctions::glTexParameteri
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0);
      QOpenGLFunctions::glTexParameteri
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0);
      QOpenGLFunctions::glTexParameteri
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0);
      *(undefined4 *)(in_RDI + 0xd0) = 0;
      QOpenGLFunctions::glBindTexture
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9);
      QOpenGLFunctions::glFramebufferTexture2D
                ((QOpenGLFunctions *)this_00,in_stack_fffffffffffffebc,attachment,
                 in_stack_fffffffffffffeb4,texture,in_stack_fffffffffffffeac);
      QOpenGLFunctions::glActiveTexture
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac);
      QOpenGLFunctions::glBindTexture
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9);
      if (*(long *)(in_RDI + 0xc0) != 0) {
        QOpenGL2PaintEngineExPrivate::transferMode
                  ((QOpenGL2PaintEngineExPrivate *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (EngineMode)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      }
      QOpenGLFunctions::glDisable
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac);
      QOpenGLFunctions::glDisable
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac);
      QOpenGLFunctions::glDisable
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac);
      QOpenGLFunctions::glDisable
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac);
      iVar3 = 0;
      sVar7 = local_38[0];
      QOpenGLFunctions::glViewport
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0,0x1a4144);
      if (*(long *)(in_RDI + 0xc0) == 0) {
        if (*(long *)(in_RDI + 200) == 0) {
          pQVar6 = (QOpenGLContext *)operator_new(0x10);
          QOpenGLShaderProgram::QOpenGLShaderProgram
                    ((QOpenGLShaderProgram *)this_00,
                     (QObject *)CONCAT44(in_stack_fffffffffffffebc,attachment));
          *(QOpenGLContext **)(in_RDI + 200) = pQVar6;
          in_stack_fffffffffffffec8 = pQVar6;
          QOpenGLContext::format();
          iVar3 = QSurfaceFormat::profile();
          in_stack_fffffffffffffed4 = CONCAT13(iVar3 == 1,(int3)in_stack_fffffffffffffed4);
          QSurfaceFormat::~QSurfaceFormat(local_50);
          bVar1 = (byte)(in_stack_fffffffffffffed4 >> 0x18) & 1;
          local_68 = 0xaaaaaaaaaaaaaaaa;
          local_60 = 0xaaaaaaaaaaaaaaaa;
          local_58 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x1a4219);
          uVar8 = (undefined7)((ulong)pQVar6 >> 8);
          QLatin1String::QLatin1String
                    ((QLatin1String *)this_00,(char *)CONCAT44(in_stack_fffffffffffffebc,attachment)
                    );
          QString::append((QLatin1String *)&local_68);
          QLatin1String::QLatin1String
                    ((QLatin1String *)this_00,(char *)CONCAT44(in_stack_fffffffffffffebc,attachment)
                    );
          QString::append((QLatin1String *)&local_68);
          QFlags<QOpenGLShader::ShaderTypeBit>::QFlags
                    ((QFlags<QOpenGLShader::ShaderTypeBit> *)
                     CONCAT44(in_stack_fffffffffffffeb4,texture),in_stack_fffffffffffffeac);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    ((QOpenGLShaderProgram *)in_stack_fffffffffffffec8,
                     (ShaderType)in_stack_fffffffffffffefc.i,(QString *)this_00);
          QString::~QString((QString *)0x1a42e8);
          local_a8 = 0xaaaaaaaaaaaaaaaa;
          local_a0 = 0xaaaaaaaaaaaaaaaa;
          local_98 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x1a4322);
          QLatin1String::QLatin1String
                    ((QLatin1String *)this_00,(char *)CONCAT44(in_stack_fffffffffffffebc,attachment)
                    );
          QString::append((QLatin1String *)&local_a8);
          sVar7 = (socklen_t)CONCAT71(uVar8,bVar1);
          QLatin1String::QLatin1String
                    ((QLatin1String *)this_00,(char *)CONCAT44(in_stack_fffffffffffffebc,attachment)
                    );
          QString::append((QLatin1String *)&local_a8);
          in_stack_fffffffffffffee0 = (GLint)*(long *)(in_RDI + 200);
          QFlags<QOpenGLShader::ShaderTypeBit>::QFlags
                    ((QFlags<QOpenGLShader::ShaderTypeBit> *)
                     CONCAT44(in_stack_fffffffffffffeb4,texture),in_stack_fffffffffffffeac);
          QOpenGLShaderProgram::addCacheableShaderFromSourceCode
                    ((QOpenGLShaderProgram *)in_stack_fffffffffffffec8,
                     (ShaderType)in_stack_fffffffffffffefc.i,(QString *)this_00);
          QString::~QString((QString *)0x1a43f1);
          QOpenGLShaderProgram::bindAttributeLocation
                    ((QOpenGLShaderProgram *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (char *)in_stack_fffffffffffffec8,(int)((ulong)this_00 >> 0x20));
          iVar3 = 0x1dd889;
          QOpenGLShaderProgram::bindAttributeLocation
                    ((QOpenGLShaderProgram *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (char *)in_stack_fffffffffffffec8,(int)((ulong)this_00 >> 0x20));
          (**(code **)(**(long **)(in_RDI + 200) + 0x60))();
          bVar2 = QOpenGLVertexArrayObject::isCreated
                            ((QOpenGLVertexArrayObject *)CONCAT44(in_stack_fffffffffffffeb4,texture)
                            );
          if (bVar2) {
            QOpenGLVertexArrayObject::bind
                      ((QOpenGLVertexArrayObject *)(in_RDI + 0x120),iVar3,__addr,sVar7);
            setupVertexAttribs((QOpenGLTextureGlyphCache *)
                               CONCAT44(in_stack_fffffffffffffeb4,texture));
          }
        }
        bVar2 = QOpenGLVertexArrayObject::isCreated
                          ((QOpenGLVertexArrayObject *)CONCAT44(in_stack_fffffffffffffeb4,texture));
        if (bVar2) {
          QOpenGLVertexArrayObject::bind
                    ((QOpenGLVertexArrayObject *)(in_RDI + 0x120),iVar3,__addr_00,sVar7);
          __addr_01 = extraout_RDX;
        }
        else {
          setupVertexAttribs((QOpenGLTextureGlyphCache *)CONCAT44(in_stack_fffffffffffffeb4,texture)
                            );
          __addr_01 = extraout_RDX_00;
        }
        QOpenGLShaderProgram::bind(*(QOpenGLShaderProgram **)(in_RDI + 200),iVar3,__addr_01,sVar7);
      }
      else {
        QOpenGL2PaintEngineExPrivate::uploadData
                  ((QOpenGL2PaintEngineExPrivate *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),(GLfloat *)this_00,
                   in_stack_fffffffffffffebc);
        QOpenGL2PaintEngineExPrivate::uploadData
                  ((QOpenGL2PaintEngineExPrivate *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),(GLfloat *)this_00,
                   in_stack_fffffffffffffebc);
        QOpenGLEngineShaderManager::useBlitProgram(this_00);
        QOpenGLEngineShaderManager::blitProgram((QOpenGLEngineShaderManager *)0x1a4537);
      }
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)this_00,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,attachment),in_stack_fffffffffffffeb4);
      QOpenGLFunctions::glDrawArrays
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9,0);
      QOpenGLFunctions::glBindTexture
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,texture),
                 in_stack_fffffffffffffeac,GVar9);
      GVar9 = 0;
      sVar7 = local_38[0];
      iVar3 = local_3c;
      QOpenGLFunctions::glCopyTexSubImage2D
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (GLenum)((ulong)in_stack_fffffffffffffec8 >> 0x20),(GLint)in_stack_fffffffffffffec8
                 ,(GLint)((ulong)this_00 >> 0x20),(GLint)this_00,in_stack_fffffffffffffebc,
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
      QOpenGLFunctions::glFramebufferRenderbuffer
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                 in_stack_fffffffffffffeac,GVar9,0,0x1a45d9);
      QOpenGLFunctions::glDeleteTextures
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                 in_stack_fffffffffffffeac,(GLuint *)0x1a45f0);
      QOpenGLFunctions::glDeleteTextures
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                 in_stack_fffffffffffffeac,(GLuint *)0x1a4607);
      QOpenGLFunctions::glBindFramebuffer
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                 in_stack_fffffffffffffeac,GVar9);
      if (*(long *)(in_RDI + 0xc0) == 0) {
        bVar2 = QOpenGLVertexArrayObject::isCreated
                          ((QOpenGLVertexArrayObject *)CONCAT44(in_stack_fffffffffffffeb4,sVar7));
        if (bVar2) {
          QOpenGLVertexArrayObject::release
                    ((QOpenGLVertexArrayObject *)CONCAT44(in_stack_fffffffffffffeb4,sVar7));
        }
        else {
          QOpenGLShaderProgram::disableAttributeArray
                    ((QOpenGLShaderProgram *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                     in_stack_fffffffffffffeac);
          QOpenGLShaderProgram::disableAttributeArray
                    ((QOpenGLShaderProgram *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                     in_stack_fffffffffffffeac);
        }
      }
      else {
        QOpenGLFunctions::glViewport
                  ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffeb4,sVar7),
                   in_stack_fffffffffffffeac,GVar9,0,0x1a465a);
        QOpenGL2PaintEngineExPrivate::updateClipScissorTest
                  ((QOpenGL2PaintEngineExPrivate *)CONCAT44(in_stack_fffffffffffffebc,iVar3));
      }
    }
    else {
      QImageTextureGlyphCache::resizeTextureData((int)in_RDI,local_c);
      QImageTextureGlyphCache::image(in_RDI);
      qMin<int>((int *)local_38,&local_c);
      qMin<int>(&local_3c,&local_10);
      load_glyph_image_region_to_texture
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,0,
                 in_stack_fffffffffffffeb4,0,in_stack_ffffffffffffff10,iVar3,ty);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureGlyphCache::resizeTextureData(int width, int height)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx == nullptr) {
        qWarning("QOpenGLTextureGlyphCache::resizeTextureData: Called with no context");
        return;
    }

    QOpenGLFunctions *funcs = ctx->functions();
    GLint oldFbo;
    funcs->glGetIntegerv(GL_FRAMEBUFFER_BINDING, &oldFbo);

    int oldWidth = m_textureResource->m_width;
    int oldHeight = m_textureResource->m_height;

    // Make the lower glyph texture size 16 x 16.
    if (width < 16)
        width = 16;
    if (height < 16)
        height = 16;

    GLuint oldTexture = m_textureResource->m_texture;
    createTextureData(width, height);

    if (ctx->d_func()->workaround_brokenFBOReadBack) {
        QImageTextureGlyphCache::resizeTextureData(width, height);
        load_glyph_image_region_to_texture(ctx, image(), 0, 0, qMin(oldWidth, width), qMin(oldHeight, height),
                                           m_textureResource->m_texture, 0, 0);
        return;
    }

    // ### the QTextureGlyphCache API needs to be reworked to allow
    // ### resizeTextureData to fail

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, m_textureResource->m_fbo);

    GLuint tmp_texture;
    funcs->glGenTextures(1, &tmp_texture);
    funcs->glBindTexture(GL_TEXTURE_2D, tmp_texture);
    funcs->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, oldWidth, oldHeight, 0,
                        GL_RGBA, GL_UNSIGNED_BYTE, nullptr);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    funcs->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    m_filterMode = Nearest;
    funcs->glBindTexture(GL_TEXTURE_2D, 0);
    funcs->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                  GL_TEXTURE_2D, tmp_texture, 0);

    funcs->glActiveTexture(GL_TEXTURE0 + QT_IMAGE_TEXTURE_UNIT);
    funcs->glBindTexture(GL_TEXTURE_2D, oldTexture);

    if (pex != nullptr)
        pex->transferMode(BrushDrawingMode);

    funcs->glDisable(GL_STENCIL_TEST);
    funcs->glDisable(GL_DEPTH_TEST);
    funcs->glDisable(GL_SCISSOR_TEST);
    funcs->glDisable(GL_BLEND);

    funcs->glViewport(0, 0, oldWidth, oldHeight);

    QOpenGLShaderProgram *blitProgram = nullptr;
    if (pex == nullptr) {
        if (m_blitProgram == nullptr) {
            m_blitProgram = new QOpenGLShaderProgram;
            const bool isCoreProfile = ctx->format().profile() == QSurfaceFormat::CoreProfile;

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainWithTexCoordsVertexShader_core : qopenglslMainWithTexCoordsVertexShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslUntransformedPositionVertexShader_core : qopenglslUntransformedPositionVertexShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, source);
            }

            {
                QString source;
#ifdef Q_OS_WASM
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
#else
                source.append(QLatin1StringView(isCoreProfile ? qopenglslMainFragmentShader_core : qopenglslMainFragmentShader));
                source.append(QLatin1StringView(isCoreProfile ? qopenglslImageSrcFragmentShader_core : qopenglslImageSrcFragmentShader));
#endif
                m_blitProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, source);
            }

            m_blitProgram->bindAttributeLocation("vertexCoordsArray", QT_VERTEX_COORDS_ATTR);
            m_blitProgram->bindAttributeLocation("textureCoordArray", QT_TEXTURE_COORDS_ATTR);

            m_blitProgram->link();

            if (m_vao.isCreated()) {
                m_vao.bind();
                setupVertexAttribs();
            }
        }

        if (m_vao.isCreated())
            m_vao.bind();
        else
            setupVertexAttribs();

        m_blitProgram->bind();
        blitProgram = m_blitProgram;

    } else {
        pex->uploadData(QT_VERTEX_COORDS_ATTR, m_vertexCoordinateArray, 8);
        pex->uploadData(QT_TEXTURE_COORDS_ATTR, m_textureCoordinateArray, 8);

        pex->shaderManager->useBlitProgram();
        blitProgram = pex->shaderManager->blitProgram();
    }

    blitProgram->setUniformValue("imageTexture", QT_IMAGE_TEXTURE_UNIT);

    funcs->glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

    funcs->glBindTexture(GL_TEXTURE_2D, m_textureResource->m_texture);

    funcs->glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, oldWidth, oldHeight);

    funcs->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
                                     GL_RENDERBUFFER, 0);
    funcs->glDeleteTextures(1, &tmp_texture);
    funcs->glDeleteTextures(1, &oldTexture);

    funcs->glBindFramebuffer(GL_FRAMEBUFFER, (GLuint)oldFbo);

    if (pex != nullptr) {
        funcs->glViewport(0, 0, pex->width, pex->height);
        pex->updateClipScissorTest();
    } else {
        if (m_vao.isCreated()) {
            m_vao.release();
        } else {
            m_blitProgram->disableAttributeArray(int(QT_VERTEX_COORDS_ATTR));
            m_blitProgram->disableAttributeArray(int(QT_TEXTURE_COORDS_ATTR));
        }
    }
}